

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  double *pdVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint8_t *puVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  buf_2d buf;
  ulong local_108;
  ulong local_e0;
  ulong local_d8;
  buf_2d local_50;
  int iVar11;
  ulong uVar12;
  
  iVar1 = (cpi->common).mi_params.mi_rows;
  iVar2 = (cpi->common).mi_params.mi_cols;
  iVar11 = iVar2 + 6;
  if (-1 < iVar2 + 3) {
    iVar11 = iVar2 + 3;
  }
  uVar10 = iVar11 >> 2;
  uVar12 = (ulong)uVar10;
  iVar11 = iVar1 + 6;
  if (-1 < iVar1 + 3) {
    iVar11 = iVar1 + 3;
  }
  uVar17 = iVar11 >> 2;
  if (iVar1 < 1) {
    dVar23 = 0.0;
  }
  else {
    puVar3 = (cpi->source->field_5).buffers[0];
    iVar11 = (cpi->source->field_4).field_0.y_stride;
    uVar19 = 1;
    if (1 < (int)uVar10) {
      uVar19 = (ulong)uVar10;
    }
    uVar9 = 1;
    if (1 < (int)uVar17) {
      uVar9 = (ulong)uVar17;
    }
    dVar23 = 0.0;
    iVar8 = 0;
    uVar14 = 0;
    local_e0 = 0;
    do {
      if (0 < iVar2) {
        iVar16 = 0;
        local_d8 = 2;
        local_108 = 0;
        do {
          uVar13 = (ulong)(cpi->common).mi_params.mi_rows;
          dVar22 = NAN;
          if ((long)(uVar14 * 4) < (long)uVar13) {
            iVar6 = (cpi->common).mi_params.mi_cols;
            dVar24 = 0.0;
            dVar22 = 0.0;
            uVar21 = local_e0;
            iVar18 = iVar8;
            do {
              if ((long)(local_108 * 4) < (long)iVar6) {
                puVar20 = puVar3 + (long)iVar18 + (long)iVar16;
                uVar13 = local_d8;
                do {
                  local_50.buf = puVar20;
                  local_50.stride = iVar11;
                  uVar7 = av1_get_perpixel_variance_facade
                                    (cpi,&(cpi->td).mb.e_mbd,&local_50,BLOCK_8X8,0);
                  dVar22 = (double)uVar7 + dVar22;
                  dVar24 = dVar24 + 1.0;
                  iVar6 = (cpi->common).mi_params.mi_cols;
                  if (local_108 * 4 + 4 <= uVar13) break;
                  puVar20 = puVar20 + 8;
                  bVar5 = (long)uVar13 < (long)iVar6;
                  uVar13 = uVar13 + 2;
                } while (bVar5);
                uVar13 = (ulong)(uint)(cpi->common).mi_params.mi_rows;
              }
              uVar21 = uVar21 + 2;
            } while ((uVar21 < uVar14 * 4 + 4) &&
                    (iVar18 = iVar18 + iVar11 * 8, (long)uVar21 < (long)(int)uVar13));
            dVar22 = (dVar22 / dVar24) * -0.0021489;
          }
          dVar22 = exp(dVar22);
          dVar22 = (1.0 - dVar22) * 67.035434 + 17.492222;
          cpi->ssim_rdmult_scaling_factors[local_108 + uVar14 * uVar12] = dVar22;
          dVar22 = log(dVar22);
          dVar23 = dVar23 + dVar22;
          local_108 = local_108 + 1;
          iVar16 = iVar16 + 0x10;
          local_d8 = local_d8 + 4;
        } while (local_108 != uVar19);
      }
      uVar14 = uVar14 + 1;
      local_e0 = local_e0 + 4;
      iVar8 = iVar8 + iVar11 * 0x10;
    } while (uVar14 != uVar9);
  }
  dVar23 = exp(dVar23 / (double)(int)(uVar17 * uVar10));
  if (0 < iVar1) {
    uVar19 = uVar12;
    if ((int)uVar10 < 2) {
      uVar19 = 1;
    }
    uVar10 = 1;
    if (1 < (int)uVar17) {
      uVar10 = uVar17;
    }
    lVar15 = 0;
    uVar9 = 0;
    do {
      if (0 < iVar2) {
        pdVar4 = cpi->ssim_rdmult_scaling_factors;
        uVar14 = 0;
        do {
          *(double *)((long)pdVar4 + uVar14 * 8 + lVar15) =
               *(double *)((long)pdVar4 + uVar14 * 8 + lVar15) / dVar23;
          uVar14 = uVar14 + 1;
        } while (uVar19 != uVar14);
      }
      uVar9 = uVar9 + 1;
      lVar15 = lVar15 + uVar12 * 8;
    } while (uVar9 != uVar10);
  }
  return;
}

Assistant:

void av1_set_mb_ssim_rdmult_scaling(AV1_COMP *cpi) {
  const CommonModeInfoParams *const mi_params = &cpi->common.mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = BLOCK_16X16;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;
  double log_sum = 0.0;

  // Loop through each 16x16 block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          var += av1_get_perpixel_variance_facade(cpi, xd, &buf, BLOCK_8X8,
                                                  AOM_PLANE_Y);
          num_of_var += 1.0;
        }
      }
      var = var / num_of_var;

      // Curve fitting with an exponential model on all 16x16 blocks from the
      // midres dataset.
      var = 67.035434 * (1 - exp(-0.0021489 * var)) + 17.492222;

      // As per the above computation, var will be in the range of
      // [17.492222, 84.527656], assuming the data type is of infinite
      // precision. The following assert conservatively checks if var is in the
      // range of [17.0, 85.0] to avoid any issues due to the precision of the
      // relevant data type.
      assert(var > 17.0 && var < 85.0);
      cpi->ssim_rdmult_scaling_factors[index] = var;
      log_sum += log(var);
    }
  }

  // As log_sum holds the geometric mean, it will be in the range
  // [17.492222, 84.527656]. Hence, in the below loop, the value of
  // cpi->ssim_rdmult_scaling_factors[index] would be in the range
  // [0.2069, 4.8323].
  log_sum = exp(log_sum / (double)(num_rows * num_cols));

  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      cpi->ssim_rdmult_scaling_factors[index] /= log_sum;
    }
  }
}